

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::CommsInterface(CommsInterface *this,thread_generation threads)

{
  int in_ESI;
  undefined8 *in_RDI;
  undefined1 in_stack_ffffffffffffff5f;
  TriggerVariable *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  TripWireDetector *this_00;
  int local_20 [5];
  int local_c;
  
  *in_RDI = &PTR__CommsInterface_00a560a8;
  local_c = in_ESI;
  std::atomic<helics::CommsInterface::ConnectionStatus>::atomic
            ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 1),STARTUP);
  gmlc::concurrency::TriggerVariable::TriggerVariable
            (in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::atomic<helics::CommsInterface::ConnectionStatus>::atomic
            ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 0x32),STARTUP);
  gmlc::concurrency::TriggerVariable::TriggerVariable
            (in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  *(bool *)((long)in_RDI + 0x259) = local_c == 0;
  *(undefined1 *)((long)in_RDI + 0x25a) = 0;
  *(undefined1 *)((long)in_RDI + 0x25b) = 1;
  *(undefined1 *)((long)in_RDI + 0x25c) = 0;
  *(undefined1 *)((long)in_RDI + 0x25d) = 0;
  *(undefined1 *)((long)in_RDI + 0x25e) = 0;
  local_20[0] = 4000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)(in_RDI + 0x4c),local_20);
  *(undefined4 *)(in_RDI + 0x4d) = 0x4000;
  *(undefined4 *)((long)in_RDI + 0x26c) = 0x200;
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  this_00 = (TripWireDetector *)(in_RDI + 0x4f);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff60);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffff60);
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::BlockingPriorityQueue
            ((BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
              *)(in_RDI + 0x57));
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  *(undefined1 *)((long)in_RDI + 0x3c1) = 0;
  CLI::std::thread::thread((thread *)0x4cb42b);
  CLI::std::thread::thread((thread *)0x4cb441);
  CLI::std::mutex::mutex((mutex *)0x4cb452);
  gmlc::concurrency::TripWireDetector::TripWireDetector(this_00);
  return;
}

Assistant:

CommsInterface::CommsInterface(thread_generation threads):
    singleThread(threads == thread_generation::single)
{
}